

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DonateStrategy.cpp
# Opt level: O1

void __thiscall
xmrig::DonateStrategy::onLogin(DonateStrategy *this,IClient *param_1,Document *doc,Value *params)

{
  MemoryPoolAllocator<rapidjson::CrtAllocator> *this_00;
  size_t sVar1;
  Data *pDVar2;
  Data *this_01;
  uint uVar3;
  char buf [40];
  Data local_78;
  Data local_68;
  Data local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  pDVar2 = &local_78;
  this_01 = &local_78;
  this_00 = doc->allocator_;
  if (this->m_tls == true) {
    local_48 = 0;
    uStack_40 = 0;
    local_58.n = (Number)0x0;
    local_58.s.str = (Ch *)0x0;
    local_38 = 0;
    snprintf((char *)&local_58,0x28,"stratum+ssl://%s",
             (((this->m_pools).super__Vector_base<xmrig::Pool,_std::allocator<xmrig::Pool>_>._M_impl
               .super__Vector_impl_data._M_start)->m_url).m_url.m_data);
    local_78.n.i64 = (Number)0x0;
    local_78.s.str = (Ch *)0x0;
    sVar1 = strlen((char *)&local_58);
    uVar3 = (uint)sVar1;
    if (uVar3 < 0xe) {
      local_78.ss.str[0xd] = '\r' - (char)sVar1;
      local_78.f.flags = 0x1c05;
    }
    else {
      local_78.f.flags = 0xc05;
      local_78.s.length = uVar3;
      pDVar2 = (Data *)rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>::Malloc
                                 (this_00,(ulong)(uVar3 + 1));
      local_78.s.str = (Ch *)((ulong)local_78.s.str & 0xffff000000000000 | (ulong)pDVar2);
    }
    memcpy(pDVar2,&local_58,sVar1 & 0xffffffff);
    *(undefined1 *)((long)pDVar2 + (sVar1 & 0xffffffff)) = 0;
    pDVar2 = &local_68;
    local_68.s.str = (Ch *)0x40500000018cbe2;
    local_68.n.i64 = (Number)0x3;
  }
  else {
    this_01 = &local_68;
    String::toJSON((String *)&this_01->s);
    pDVar2 = &local_58;
    local_58.s.str = (Ch *)0x40500000018cbe2;
    local_58.n.i64 = (Number)0x3;
  }
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(params,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&pDVar2->s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&this_01->s,this_00);
  return;
}

Assistant:

void xmrig::DonateStrategy::onLogin(IClient *, rapidjson::Document &doc, rapidjson::Value &params)
{
    using namespace rapidjson;
    auto &allocator = doc.GetAllocator();

#   ifdef XMRIG_FEATURE_TLS
    if (m_tls) {
        char buf[40] = { 0 };
        snprintf(buf, sizeof(buf), "stratum+ssl://%s", m_pools[0].url().data());
        params.AddMember("url", Value(buf, allocator), allocator);
    }
    else {
        params.AddMember("url", m_pools[1].url().toJSON(), allocator);
    }
#   else
    params.AddMember("url", m_pools[0].url().toJSON(), allocator);
#   endif

}